

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<wchar_t>::CharClass
          (CharClass<wchar_t> *this,initializer_list<wchar_t> *ch_list)

{
  Range<wchar_t> local_48;
  wchar_t local_34;
  const_iterator pwStack_30;
  wchar_t ch;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<wchar_t> *__range2;
  initializer_list<wchar_t> *ch_list_local;
  CharClass<wchar_t> *this_local;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_002794e0;
  __range2 = ch_list;
  ch_list_local = (initializer_list<wchar_t> *)this;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::vector
            (&this->m_ranges);
  __begin2 = (const_iterator)__range2;
  __end2 = std::initializer_list<wchar_t>::begin(__range2);
  pwStack_30 = std::initializer_list<wchar_t>::end((initializer_list<wchar_t> *)__begin2);
  for (; __end2 != pwStack_30; __end2 = __end2 + 1) {
    local_34 = *__end2;
    Range<wchar_t>::Range(&local_48,local_34,local_34 + L'\x01');
    std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
              (&this->m_ranges,&local_48);
    Range<wchar_t>::~Range(&local_48);
  }
  return;
}

Assistant:

CharClass(const std::initializer_list<wchar_t>& ch_list)
    {
        for (wchar_t ch : ch_list)
        {
            m_ranges.push_back(Range<TCHAR>(ch, ch + 1));
        }
    }